

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O3

bool __thiscall jrtplib::RTCPScheduler::IsTime(RTCPScheduler *this)

{
  RTPInternalSourceData *pRVar1;
  bool sender;
  double dVar2;
  RTPTime RVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  timespec tpSys;
  timespec tpMono;
  timespec local_38;
  timespec local_28;
  
  if (this->firstcall == true) {
    this->firstcall = false;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_38);
      clock_gettime(1,&local_28);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar2 - ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
    }
    else {
      clock_gettime(1,&local_38);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    (this->prevrtcptime).m_t = dVar2;
    this->pmembers = this->sources->activecount;
    CalculateNextRTCPTime(this);
  }
  else {
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_38);
      clock_gettime(1,&local_28);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar2 - ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
    }
    else {
      clock_gettime(1,&local_38);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    if ((this->nextrtcptime).m_t <= dVar2) {
      if (this->byescheduled == false) {
        pRVar1 = this->sources->owndata;
        if (pRVar1 == (RTPInternalSourceData *)0x0) {
          sender = false;
        }
        else {
          sender = (pRVar1->super_RTPSourceData).issender;
        }
        RVar3 = CalculateDeterministicInterval(this,sender);
        (*this->rtprand->_vptr_RTPRandom[5])();
        RVar3.m_t = ((extraout_XMM0_Qa + 0.5) * RVar3.m_t) / 1.21828;
      }
      else {
        RVar3 = CalculateBYETransmissionInterval(this);
      }
      dVar4 = RVar3.m_t + (this->prevrtcptime).m_t;
      if (dVar4 <= dVar2) {
        this->byescheduled = false;
        (this->prevrtcptime).m_t = dVar2;
        this->pmembers = this->sources->activecount;
        CalculateNextRTCPTime(this);
        return true;
      }
      (this->nextrtcptime).m_t = dVar4;
      this->pmembers = this->sources->activecount;
    }
  }
  return false;
}

Assistant:

bool RTCPScheduler::IsTime()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return false;
	}

	RTPTime currenttime = RTPTime::CurrentTime();

//	// TODO: for debugging
//	double diff = nextrtcptime.GetDouble() - currenttime.GetDouble();
//
//	std::cout << "Delay till next RTCP interval: " << diff << std::endl;
	
	if (currenttime < nextrtcptime) // timer has not yet expired
		return false;

	RTPTime checktime(0,0);
	
	if (!byescheduled)
	{
		bool aresender = false;
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
			aresender = srcdat->IsSender();
		
		checktime = CalculateTransmissionInterval(aresender);
	}
	else
		checktime = CalculateBYETransmissionInterval();
	
//	std::cout << "Calculated checktime: " << checktime.GetDouble() << std::endl;
	
	checktime += prevrtcptime;
	
	if (checktime <= currenttime) // Okay
	{
		byescheduled = false;
		prevrtcptime = currenttime;
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return true;
	}

//	std::cout << "New delay: " << nextrtcptime.GetDouble() - currenttime.GetDouble() << std::endl;
	
	nextrtcptime = checktime;
	pmembers = sources.GetActiveMemberCount();
	
	return false;
}